

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disassembler.cpp
# Opt level: O0

void __thiscall LLVMBC::StreamState::append(StreamState *this,CastInst *cast,bool decl)

{
  CastOps op;
  uint64_t local_48;
  Type *local_40;
  Value *local_38;
  char *local_30;
  uint64_t local_28;
  undefined1 local_19;
  CastInst *pCStack_18;
  bool decl_local;
  CastInst *cast_local;
  StreamState *this_local;
  
  local_19 = decl;
  pCStack_18 = cast;
  cast_local = (CastInst *)this;
  if (decl) {
    local_28 = Value::get_tween_id((Value *)cast);
    op = CastInst::getOpcode(pCStack_18);
    local_30 = to_string(op);
    local_38 = Instruction::getOperand(&pCStack_18->super_Instruction,0);
    local_40 = Value::getType((Value *)pCStack_18);
    append<char_const(&)[2],unsigned_long,char_const(&)[4],char_const*,char_const(&)[2],LLVMBC::Value*,char_const(&)[5],LLVMBC::Type*>
              (this,(char (*) [2])0x2a90be,&local_28,(char (*) [4])" = ",&local_30,
               (char (*) [2])0x2a8f72,&local_38,(char (*) [5])" to ",&local_40);
  }
  else {
    local_48 = Value::get_tween_id((Value *)cast);
    append<char_const(&)[2],unsigned_long>(this,(char (*) [2])0x2a90be,&local_48);
  }
  return;
}

Assistant:

void StreamState::append(CastInst *cast, bool decl)
{
	if (decl)
	{
		append("%", cast->get_tween_id(), " = ", to_string(cast->getOpcode()), " ", cast->getOperand(0), " to ",
		       cast->getType());
	}
	else
	{
		append("%", cast->get_tween_id());
	}
}